

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::Token> local_40;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::Token>(&local_40,&this->_value,false);
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
              (__return_storage_ptr__,&local_40);
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_40);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined8 *)&__return_storage_ptr__->contained = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }